

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O0

int redisvFormatCommand(char **target,char *format,__va_list_tag *ap)

{
  char cVar1;
  uint uVar2;
  void *t;
  char *__src;
  uint32_t uVar3;
  int iVar4;
  char **ppcVar5;
  size_t sVar6;
  sds pcVar7;
  char *pcVar8;
  ushort **ppuVar9;
  ulong __n;
  int iVar10;
  bool bVar11;
  size_t *local_110;
  undefined8 *local_f8;
  undefined8 *local_e0;
  undefined1 auStack_c8 [8];
  va_list _cpy;
  size_t _l;
  char *_p;
  char _format [16];
  size_t size;
  char *arg;
  int j;
  int error_type;
  int totlen;
  int argc;
  char **newargv;
  char **curargv;
  sds pcStack_50;
  int touched;
  sds newarg;
  sds curarg;
  int pos;
  char *cmd;
  char *c;
  __va_list_tag *ap_local;
  char *format_local;
  char **target_local;
  
  bVar11 = false;
  newargv = (char **)0x0;
  error_type = 0;
  j = 0;
  if (target == (char **)0x0) {
    return -1;
  }
  newarg = sdsempty();
  cmd = format;
  if (newarg == (sds)0x0) {
    return -1;
  }
  for (; *cmd != '\0'; cmd = cmd + 1) {
    if ((*cmd == '%') && (cmd[1] != '\0')) {
      pcStack_50 = newarg;
      cVar1 = cmd[1];
      if (cVar1 == '%') {
        pcStack_50 = sdscat(newarg,"%");
      }
      else if (cVar1 == 'b') {
        uVar2 = ap->gp_offset;
        if (uVar2 < 0x29) {
          local_f8 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
          ap->gp_offset = uVar2 + 8;
        }
        else {
          local_f8 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = local_f8 + 1;
        }
        t = (void *)*local_f8;
        uVar2 = ap->gp_offset;
        if (uVar2 < 0x29) {
          local_110 = (size_t *)((long)(int)uVar2 + (long)ap->reg_save_area);
          ap->gp_offset = uVar2 + 8;
        }
        else {
          local_110 = (size_t *)ap->overflow_arg_area;
          ap->overflow_arg_area = local_110 + 1;
        }
        _format._8_8_ = *local_110;
        if (_format._8_8_ != 0) {
          pcStack_50 = sdscatlen(newarg,t,_format._8_8_);
        }
      }
      else {
        _l = (size_t)cmd;
        if (cVar1 == 's') {
          uVar2 = ap->gp_offset;
          if (uVar2 < 0x29) {
            local_e0 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            local_e0 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_e0 + 1;
          }
          pcVar8 = (char *)*local_e0;
          _format._8_8_ = strlen(pcVar8);
          if (_format._8_8_ != 0) {
            pcStack_50 = sdscatlen(newarg,pcVar8,_format._8_8_);
          }
        }
        else {
          do {
            _l = _l + 1;
            bVar11 = false;
            if (*(char *)_l != '\0') {
              pcVar8 = strchr("#0-+ ",(int)*(char *)_l);
              bVar11 = pcVar8 != (char *)0x0;
            }
          } while (bVar11);
          while( true ) {
            bVar11 = false;
            if (*(char *)_l != '\0') {
              ppuVar9 = __ctype_b_loc();
              bVar11 = ((*ppuVar9)[(int)*(char *)_l] & 0x800) != 0;
            }
            if (!bVar11) break;
            _l = _l + 1;
          }
          if (*(char *)_l == '.') {
            do {
              _l = _l + 1;
              bVar11 = false;
              if (*(char *)_l != '\0') {
                ppuVar9 = __ctype_b_loc();
                bVar11 = ((*ppuVar9)[(int)*(char *)_l] & 0x800) != 0;
              }
            } while (bVar11);
          }
          _cpy[0].overflow_arg_area = ap->reg_save_area;
          auStack_c8._0_4_ = ap->gp_offset;
          auStack_c8._4_4_ = ap->fp_offset;
          _cpy[0]._0_8_ = ap->overflow_arg_area;
          pcVar8 = strchr("diouxX",(int)*(char *)_l);
          if (pcVar8 == (char *)0x0) {
            pcVar8 = strchr("eEfFgGaA",(int)*(char *)_l);
            if (pcVar8 == (char *)0x0) {
              if ((*(char *)_l == 'h') && (*(char *)(_l + 1) == 'h')) {
                _l = _l + 2;
                if ((*(char *)_l == '\0') ||
                   (pcVar8 = strchr("diouxX",(int)*(char *)_l), pcVar8 == (char *)0x0))
                goto LAB_0010686d;
                if (ap->gp_offset < 0x29) {
                  ap->gp_offset = ap->gp_offset + 8;
                }
                else {
                  ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
                }
              }
              else if (*(char *)_l == 'h') {
                _l = _l + 1;
                if ((*(char *)_l == '\0') ||
                   (pcVar8 = strchr("diouxX",(int)*(char *)_l), pcVar8 == (char *)0x0))
                goto LAB_0010686d;
                if (ap->gp_offset < 0x29) {
                  ap->gp_offset = ap->gp_offset + 8;
                }
                else {
                  ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
                }
              }
              else if ((*(char *)_l == 'l') && (*(char *)(_l + 1) == 'l')) {
                _l = _l + 2;
                if ((*(char *)_l == '\0') ||
                   (pcVar8 = strchr("diouxX",(int)*(char *)_l), pcVar8 == (char *)0x0)) {
LAB_0010686d:
                  arg._4_4_ = -2;
                  goto LAB_00106b5f;
                }
                if (ap->gp_offset < 0x29) {
                  ap->gp_offset = ap->gp_offset + 8;
                }
                else {
                  ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
                }
              }
              else {
                if ((*(char *)_l != 'l') ||
                   ((_l = _l + 1, *(char *)_l == '\0' ||
                    (pcVar8 = strchr("diouxX",(int)*(char *)_l), pcVar8 == (char *)0x0))))
                goto LAB_0010686d;
                if (ap->gp_offset < 0x29) {
                  ap->gp_offset = ap->gp_offset + 8;
                }
                else {
                  ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
                }
              }
            }
            else if (ap->fp_offset < 0xa1) {
              ap->fp_offset = ap->fp_offset + 0x10;
            }
            else {
              ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
            }
          }
          else if (ap->gp_offset < 0x29) {
            ap->gp_offset = ap->gp_offset + 8;
          }
          else {
            ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
          }
          __n = (_l + 1) - (long)cmd;
          if (__n < 0xe) {
            memcpy(&_p,cmd,__n);
            _format[__n - 8] = '\0';
            pcStack_50 = sdscatvprintf(newarg,(char *)&_p,(__va_list_tag *)auStack_c8);
            cmd = (char *)(_l - 1);
          }
        }
      }
      if (pcStack_50 == (sds)0x0) goto LAB_00106b58;
      newarg = pcStack_50;
      bVar11 = true;
      cmd = cmd + 1;
    }
    else if (*cmd == ' ') {
      if (bVar11) {
        ppcVar5 = (char **)realloc(newargv,(long)(error_type + 1) << 3);
        if (ppcVar5 == (char **)0x0) goto LAB_00106b58;
        iVar10 = error_type + 1;
        ppcVar5[error_type] = newarg;
        sVar6 = sdslen(newarg);
        sVar6 = bulklen(sVar6);
        j = j + (int)sVar6;
        newarg = sdsempty();
        error_type = iVar10;
        newargv = ppcVar5;
        if (newarg == (sds)0x0) goto LAB_00106b58;
        bVar11 = false;
      }
    }
    else {
      pcVar7 = sdscatlen(newarg,cmd,1);
      if (pcVar7 == (sds)0x0) goto LAB_00106b58;
      bVar11 = true;
      newarg = pcVar7;
    }
  }
  if (bVar11) {
    ppcVar5 = (char **)realloc(newargv,(long)(error_type + 1) << 3);
    if (ppcVar5 == (char **)0x0) goto LAB_00106b58;
    ppcVar5[error_type] = newarg;
    sVar6 = sdslen(newarg);
    sVar6 = bulklen(sVar6);
    j = j + (int)sVar6;
    error_type = error_type + 1;
    newargv = ppcVar5;
  }
  else {
    sdsfree(newarg);
  }
  newarg = (sds)0x0;
  uVar3 = countDigits((long)error_type);
  iVar10 = uVar3 + 3 + j;
  pcVar8 = (char *)malloc((long)(iVar10 + 1));
  if (pcVar8 != (char *)0x0) {
    curarg._4_4_ = sprintf(pcVar8,"*%d\r\n",(ulong)(uint)error_type);
    for (arg._0_4_ = 0; (int)arg < error_type; arg._0_4_ = (int)arg + 1) {
      sVar6 = sdslen(newargv[(int)arg]);
      iVar4 = sprintf(pcVar8 + curarg._4_4_,"$%zu\r\n",sVar6);
      __src = newargv[(int)arg];
      sVar6 = sdslen(newargv[(int)arg]);
      memcpy(pcVar8 + (iVar4 + curarg._4_4_),__src,sVar6);
      sVar6 = sdslen(newargv[(int)arg]);
      iVar4 = iVar4 + curarg._4_4_ + (int)sVar6;
      sdsfree(newargv[(int)arg]);
      pcVar8[iVar4] = '\r';
      curarg._4_4_ = iVar4 + 2;
      pcVar8[iVar4 + 1] = '\n';
    }
    if (curarg._4_4_ == iVar10) {
      pcVar8[curarg._4_4_] = '\0';
      free(newargv);
      *target = pcVar8;
      return iVar10;
    }
    __assert_fail("pos == totlen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                  ,0x1e5,"int redisvFormatCommand(char **, const char *, struct __va_list_tag *)");
  }
LAB_00106b58:
  arg._4_4_ = -1;
LAB_00106b5f:
  if (newargv != (char **)0x0) {
    while (error_type != 0) {
      sdsfree(newargv[error_type + -1]);
      error_type = error_type + -1;
    }
    free(newargv);
  }
  sdsfree(newarg);
  free((void *)0x0);
  return arg._4_4_;
}

Assistant:

int redisvFormatCommand(char **target, const char *format, va_list ap) {
    const char *c = format;
    char *cmd = NULL; /* final command */
    int pos; /* position in final command */
    sds curarg, newarg; /* current argument */
    int touched = 0; /* was the current argument touched? */
    char **curargv = NULL, **newargv = NULL;
    int argc = 0;
    int totlen = 0;
    int error_type = 0; /* 0 = no error; -1 = memory error; -2 = format error */
    int j;

    /* Abort if there is not target to set */
    if (target == NULL)
        return -1;

    /* Build the command string accordingly to protocol */
    curarg = sdsempty();
    if (curarg == NULL)
        return -1;

    while(*c != '\0') {
        if (*c != '%' || c[1] == '\0') {
            if (*c == ' ') {
                if (touched) {
                    newargv = realloc(curargv,sizeof(char*)*(argc+1));
                    if (newargv == NULL) goto memory_err;
                    curargv = newargv;
                    curargv[argc++] = curarg;
                    totlen += bulklen(sdslen(curarg));

                    /* curarg is put in argv so it can be overwritten. */
                    curarg = sdsempty();
                    if (curarg == NULL) goto memory_err;
                    touched = 0;
                }
            } else {
                newarg = sdscatlen(curarg,c,1);
                if (newarg == NULL) goto memory_err;
                curarg = newarg;
                touched = 1;
            }
        } else {
            char *arg;
            size_t size;

            /* Set newarg so it can be checked even if it is not touched. */
            newarg = curarg;

            switch(c[1]) {
            case 's':
                arg = va_arg(ap,char*);
                size = strlen(arg);
                if (size > 0)
                    newarg = sdscatlen(curarg,arg,size);
                break;
            case 'b':
                arg = va_arg(ap,char*);
                size = va_arg(ap,size_t);
                if (size > 0)
                    newarg = sdscatlen(curarg,arg,size);
                break;
            case '%':
                newarg = sdscat(curarg,"%");
                break;
            default:
                /* Try to detect printf format */
                {
                    static const char intfmts[] = "diouxX";
                    static const char flags[] = "#0-+ ";
                    char _format[16];
                    const char *_p = c+1;
                    size_t _l = 0;
                    va_list _cpy;

                    /* Flags */
                    while (*_p != '\0' && strchr(flags,*_p) != NULL) _p++;

                    /* Field width */
                    while (*_p != '\0' && isdigit(*_p)) _p++;

                    /* Precision */
                    if (*_p == '.') {
                        _p++;
                        while (*_p != '\0' && isdigit(*_p)) _p++;
                    }

                    /* Copy va_list before consuming with va_arg */
                    va_copy(_cpy,ap);

                    /* Integer conversion (without modifiers) */
                    if (strchr(intfmts,*_p) != NULL) {
                        va_arg(ap,int);
                        goto fmt_valid;
                    }

                    /* Double conversion (without modifiers) */
                    if (strchr("eEfFgGaA",*_p) != NULL) {
                        va_arg(ap,double);
                        goto fmt_valid;
                    }

                    /* Size: char */
                    if (_p[0] == 'h' && _p[1] == 'h') {
                        _p += 2;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,int); /* char gets promoted to int */
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: short */
                    if (_p[0] == 'h') {
                        _p += 1;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,int); /* short gets promoted to int */
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: long long */
                    if (_p[0] == 'l' && _p[1] == 'l') {
                        _p += 2;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,long long);
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: long */
                    if (_p[0] == 'l') {
                        _p += 1;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,long);
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                fmt_invalid:
                    va_end(_cpy);
                    goto format_err;

                fmt_valid:
                    _l = (_p+1)-c;
                    if (_l < sizeof(_format)-2) {
                        memcpy(_format,c,_l);
                        _format[_l] = '\0';
                        newarg = sdscatvprintf(curarg,_format,_cpy);

                        /* Update current position (note: outer blocks
                         * increment c twice so compensate here) */
                        c = _p-1;
                    }

                    va_end(_cpy);
                    break;
                }
            }

            if (newarg == NULL) goto memory_err;
            curarg = newarg;

            touched = 1;
            c++;
        }
        c++;
    }

    /* Add the last argument if needed */
    if (touched) {
        newargv = realloc(curargv,sizeof(char*)*(argc+1));
        if (newargv == NULL) goto memory_err;
        curargv = newargv;
        curargv[argc++] = curarg;
        totlen += bulklen(sdslen(curarg));
    } else {
        sdsfree(curarg);
    }

    /* Clear curarg because it was put in curargv or was free'd. */
    curarg = NULL;

    /* Add bytes needed to hold multi bulk count */
    totlen += 1+countDigits(argc)+2;

    /* Build the command at protocol level */
    cmd = malloc(totlen+1);
    if (cmd == NULL) goto memory_err;

    pos = sprintf(cmd,"*%d\r\n",argc);
    for (j = 0; j < argc; j++) {
        pos += sprintf(cmd+pos,"$%zu\r\n",sdslen(curargv[j]));
        memcpy(cmd+pos,curargv[j],sdslen(curargv[j]));
        pos += sdslen(curargv[j]);
        sdsfree(curargv[j]);
        cmd[pos++] = '\r';
        cmd[pos++] = '\n';
    }
    assert(pos == totlen);
    cmd[pos] = '\0';

    free(curargv);
    *target = cmd;
    return totlen;

format_err:
    error_type = -2;
    goto cleanup;

memory_err:
    error_type = -1;
    goto cleanup;

cleanup:
    if (curargv) {
        while(argc--)
            sdsfree(curargv[argc]);
        free(curargv);
    }

    sdsfree(curarg);
    free(cmd);

    return error_type;
}